

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lockstep_scheduler_test.cpp
# Opt level: O3

void test_condition_timing_out(void)

{
  atomic<bool> should_have_timed_out;
  thread thread;
  pthread_mutex_t lock;
  LockstepScheduler ls;
  pthread_cond_t cond;
  undefined1 local_d1;
  long local_d0;
  long *local_c8;
  pthread_mutex_t local_c0;
  LockstepScheduler local_98;
  pthread_cond_t local_48;
  
  pthread_cond_init(&local_48,(pthread_condattr_t *)0x0);
  pthread_mutex_init(&local_c0,(pthread_mutexattr_t *)0x0);
  local_98.timed_waits_mutex_.super___mutex_base._M_mutex.__size[0x20] = '\0';
  local_98._65_8_ = 0;
  local_98.timed_waits_mutex_.super___mutex_base._M_mutex._16_8_ = 0;
  local_98.timed_waits_mutex_.super___mutex_base._M_mutex.__size[0x18] = '\0';
  local_98.timed_waits_mutex_.super___mutex_base._M_mutex._25_7_ = 0;
  local_98.timed_waits_mutex_.super___mutex_base._M_mutex.__align = 0;
  local_98.timed_waits_mutex_.super___mutex_base._M_mutex._8_8_ = 0;
  local_98.timed_waits_.
  super__Vector_base<std::shared_ptr<LockstepScheduler::TimedWait>,_std::allocator<std::shared_ptr<LockstepScheduler::TimedWait>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.timed_waits_.
  super__Vector_base<std::shared_ptr<LockstepScheduler::TimedWait>,_std::allocator<std::shared_ptr<LockstepScheduler::TimedWait>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.time_us_.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
  local_98.timed_waits_.
  super__Vector_base<std::shared_ptr<LockstepScheduler::TimedWait>,_std::allocator<std::shared_ptr<LockstepScheduler::TimedWait>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  LockstepScheduler::set_absolute_time(&local_98,0xbc614e);
  local_d1 = 0;
  pthread_mutex_lock(&local_c0);
  local_d0 = 0;
  local_c8 = (long *)operator_new(0x28);
  *local_c8 = (long)&PTR___State_00109c60;
  local_c8[1] = (long)&local_98;
  local_c8[2] = (long)&local_48;
  local_c8[3] = (long)&local_c0;
  local_c8[4] = (long)&local_d1;
  std::thread::_M_start_thread(&local_d0,&local_c8,0);
  if (local_c8 != (long *)0x0) {
    (**(code **)(*local_c8 + 8))();
  }
  LockstepScheduler::set_absolute_time(&local_98,0xbc6342);
  LOCK();
  local_d1 = 1;
  UNLOCK();
  LockstepScheduler::set_absolute_time(&local_98,0xbc672a);
  std::thread::join();
  pthread_mutex_destroy(&local_c0);
  pthread_cond_destroy(&local_48);
  if (local_d0 == 0) {
    std::
    vector<std::shared_ptr<LockstepScheduler::TimedWait>,_std::allocator<std::shared_ptr<LockstepScheduler::TimedWait>_>_>
    ::~vector(&local_98.timed_waits_);
    return;
  }
  std::terminate();
}

Assistant:

void test_condition_timing_out()
{
    // Create locked condition.
    pthread_cond_t cond;
    pthread_cond_init(&cond, NULL);

    // And a lock which needs to be locked
    pthread_mutex_t lock;
    pthread_mutex_init(&lock, NULL);

    LockstepScheduler ls;
    ls.set_absolute_time(some_time_us);

    std::atomic<bool> should_have_timed_out{false};
    pthread_mutex_lock(&lock);

    // Use a thread to wait for condition while we already have the lock.
    // This ensures the synchronization happens in the right order.
    std::thread thread([&ls, &cond, &lock, &should_have_timed_out]() {
        assert(ls.cond_timedwait(&cond, &lock, some_time_us + 1000) == -1);
        assert(errno == ETIMEDOUT);
        assert(should_have_timed_out);
        // It should be re-locked afterwards, so we should be able to unlock it.
        assert(pthread_mutex_unlock(&lock) == 0);
    });

    ls.set_absolute_time(some_time_us + 500);
    should_have_timed_out = true;
    ls.set_absolute_time(some_time_us + 1500);

    thread.join();

    pthread_mutex_destroy(&lock);
    pthread_cond_destroy(&cond);

}